

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

void __thiscall DiskTableNode::loadIndexFilter(DiskTableNode *this)

{
  size_t n;
  pointer pSVar1;
  SSTableIndex *pSVar2;
  IndexMap *pIVar3;
  SSTableHeader *pSVar4;
  BloomFilter<long_long> *this_00;
  _Rb_tree_header *p_Var5;
  SSTableIndex *__range2;
  SSTableIndexItem *item;
  pointer data;
  _Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> local_58;
  pair<const_long_long,_unsigned_long> local_38;
  
  if ((this->index == (IndexMap *)0x0) && (this->filter == (Filter *)0x0)) {
    pSVar2 = SSTable::getIndex(this->_sstable);
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_58._M_impl.super__Vector_impl_data._M_finish =
         (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar3 = (IndexMap *)operator_new(0x30);
    p_Var5 = &(pIVar3->_M_t)._M_impl.super__Rb_tree_header;
    (pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(pIVar3->_M_t)._M_impl = 0;
    *(undefined8 *)&(pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
    (pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
    (pIVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->index = pIVar3;
    pSVar4 = getHeader(this);
    n = pSVar4->entries_count;
    this_00 = (BloomFilter<long_long> *)operator_new(0x60);
    BloomFilter<long_long>::BloomFilter(this_00,n * 10,n,0,4);
    pSVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
    this->filter = this_00;
    for (data = local_58._M_impl.super__Vector_impl_data._M_start; data != pSVar1; data = data + 1)
    {
      local_38.first = data->key;
      local_38.second = data->offset;
      std::
      _Rb_tree<long_long,std::pair<long_long_const,unsigned_long>,std::_Select1st<std::pair<long_long_const,unsigned_long>>,std::less<long_long>,std::allocator<std::pair<long_long_const,unsigned_long>>>
      ::_M_insert_unique<std::pair<long_long_const,unsigned_long>>
                ((_Rb_tree<long_long,std::pair<long_long_const,unsigned_long>,std::_Select1st<std::pair<long_long_const,unsigned_long>>,std::less<long_long>,std::allocator<std::pair<long_long_const,unsigned_long>>>
                  *)this->index,&local_38);
      BloomFilter<long_long>::add(this->filter,&data->key);
    }
    std::_Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::~_Vector_base(&local_58)
    ;
  }
  return;
}

Assistant:

void DiskTableNode::loadIndexFilter() {
    if (index == nullptr && filter == nullptr) {
        // Info from _sstable->index is used to generate filter and index, dont need after that.
        auto ssindex = SSTableIndex{std::move(*_sstable->getIndex())};
        index = new IndexMap{};
        auto count = getHeader()->entries_count;
        filter = new Filter{10 * count, count, 0};
        for (const auto &item:ssindex) {
            index->insert({item.key, item.offset});
            filter->add(item.key);
        }
    }
}